

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_update_hashes(SAM_hdr *sh,int type,SAM_hdr_type *h_type)

{
  int iVar1;
  uint32_t uVar2;
  SAM_SQ *pSVar3;
  char *pcVar4;
  SAM_RG *pSVar5;
  size_t sVar6;
  SAM_PG *pSVar7;
  int *piVar8;
  int local_80;
  int local_7c;
  khint_t local_78;
  int r_2;
  khint_t k_3;
  int i;
  int p_id;
  int iStack_64;
  char tmp;
  khint_t k_2;
  int npg;
  SAM_hdr_tag *tag_2;
  khint_t local_50;
  int r_1;
  khint_t k_1;
  int nrg;
  SAM_hdr_tag *tag_1;
  khint_t local_38;
  int r;
  khint_t k;
  int nref;
  SAM_hdr_tag *tag;
  SAM_hdr_type *h_type_local;
  SAM_hdr *pSStack_18;
  int type_local;
  SAM_hdr *sh_local;
  
  tag = (SAM_hdr_tag *)h_type;
  h_type_local._4_4_ = type;
  pSStack_18 = sh;
  if ((type >> 8 == 0x53) && ((type & 0xffU) == 0x51)) {
    r = sh->nref;
    pSVar3 = (SAM_SQ *)realloc(sh->ref,(long)(sh->nref + 1) << 5);
    pSStack_18->ref = pSVar3;
    if (pSStack_18->ref == (SAM_SQ *)0x0) {
      return -1;
    }
    _k = *(SAM_hdr_tag **)&tag->len;
    pSStack_18->ref[r].name = (char *)0x0;
    pSStack_18->ref[r].len = 0;
    pSStack_18->ref[r].ty = (SAM_hdr_type *)tag;
    pSStack_18->ref[r].tag = _k;
    for (; _k != (SAM_hdr_tag *)0x0; _k = _k->next) {
      if ((*_k->str == 'S') && (_k->str[1] == 'N')) {
        pcVar4 = (char *)malloc((long)_k->len);
        pSStack_18->ref[r].name = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return -1;
        }
        strncpy(pSStack_18->ref[r].name,_k->str + 3,(long)(_k->len + -3));
        pSStack_18->ref[r].name[_k->len + -3] = '\0';
      }
      else if ((*_k->str == 'L') && (_k->str[1] == 'N')) {
        uVar2 = atoi(_k->str + 3);
        pSStack_18->ref[r].len = uVar2;
      }
    }
    if (pSStack_18->ref[r].name != (char *)0x0) {
      local_38 = kh_put_m_s2i(pSStack_18->ref_hash,pSStack_18->ref[r].name,(int *)((long)&tag_1 + 4)
                             );
      if (tag_1._4_4_ == -1) {
        return -1;
      }
      pSStack_18->ref_hash->vals[local_38] = r;
    }
    pSStack_18->nref = pSStack_18->nref + 1;
  }
  if (((int)h_type_local._4_4_ >> 8 == 0x52) && ((h_type_local._4_4_ & 0xff) == 0x47)) {
    r_1 = pSStack_18->nrg;
    pSVar5 = (SAM_RG *)realloc(pSStack_18->rg,(long)(pSStack_18->nrg + 1) << 5);
    pSStack_18->rg = pSVar5;
    if (pSStack_18->rg == (SAM_RG *)0x0) {
      return -1;
    }
    _k_1 = *(SAM_hdr_tag **)&tag->len;
    pSStack_18->rg[r_1].name = (char *)0x0;
    pSStack_18->rg[r_1].name_len = 0;
    pSStack_18->rg[r_1].ty = (SAM_hdr_type *)tag;
    pSStack_18->rg[r_1].tag = _k_1;
    pSStack_18->rg[r_1].id = r_1;
    for (; _k_1 != (SAM_hdr_tag *)0x0; _k_1 = _k_1->next) {
      if ((*_k_1->str == 'I') && (_k_1->str[1] == 'D')) {
        pcVar4 = (char *)malloc((long)_k_1->len);
        pSStack_18->rg[r_1].name = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return -1;
        }
        strncpy(pSStack_18->rg[r_1].name,_k_1->str + 3,(long)(_k_1->len + -3));
        pSStack_18->rg[r_1].name[_k_1->len + -3] = '\0';
        sVar6 = strlen(pSStack_18->rg[r_1].name);
        pSStack_18->rg[r_1].name_len = (int)sVar6;
      }
    }
    if (pSStack_18->rg[r_1].name != (char *)0x0) {
      local_50 = kh_put_m_s2i(pSStack_18->rg_hash,pSStack_18->rg[r_1].name,(int *)((long)&tag_2 + 4)
                             );
      if (tag_2._4_4_ == -1) {
        return -1;
      }
      pSStack_18->rg_hash->vals[local_50] = r_1;
    }
    pSStack_18->nrg = pSStack_18->nrg + 1;
  }
  if (((int)h_type_local._4_4_ >> 8 == 0x50) && ((h_type_local._4_4_ & 0xff) == 0x47)) {
    iStack_64 = pSStack_18->npg;
    pSVar7 = (SAM_PG *)realloc(pSStack_18->pg,(long)(pSStack_18->npg + 1) * 0x28);
    pSStack_18->pg = pSVar7;
    if (pSStack_18->pg == (SAM_PG *)0x0) {
      return -1;
    }
    _k_2 = *(SAM_hdr_tag **)&tag->len;
    pSStack_18->pg[iStack_64].name = (char *)0x0;
    pSStack_18->pg[iStack_64].name_len = 0;
    pSStack_18->pg[iStack_64].ty = (SAM_hdr_type *)tag;
    pSStack_18->pg[iStack_64].tag = _k_2;
    pSStack_18->pg[iStack_64].id = iStack_64;
    pSStack_18->pg[iStack_64].prev_id = -1;
    for (; _k_2 != (SAM_hdr_tag *)0x0; _k_2 = _k_2->next) {
      if ((*_k_2->str == 'I') && (_k_2->str[1] == 'D')) {
        pcVar4 = (char *)malloc((long)_k_2->len);
        pSStack_18->pg[iStack_64].name = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return -1;
        }
        strncpy(pSStack_18->pg[iStack_64].name,_k_2->str + 3,(long)(_k_2->len + -3));
        pSStack_18->pg[iStack_64].name[_k_2->len + -3] = '\0';
        sVar6 = strlen(pSStack_18->pg[iStack_64].name);
        pSStack_18->pg[iStack_64].name_len = (int)sVar6;
      }
      else if ((*_k_2->str == 'P') && (_k_2->str[1] == 'P')) {
        i._3_1_ = _k_2->str[_k_2->len];
        _k_2->str[_k_2->len] = '\0';
        p_id = kh_get_m_s2i(pSStack_18->pg_hash,_k_2->str + 3);
        _k_2->str[_k_2->len] = i._3_1_;
        if (p_id == pSStack_18->pg_hash->n_buckets) {
          pSStack_18->pg[iStack_64].prev_id = -1;
        }
        else {
          k_3 = pSStack_18->pg_hash->vals[(uint)p_id];
          pSStack_18->pg[iStack_64].prev_id = pSStack_18->pg[(int)k_3].id;
          if ((pSStack_18->npg_end < 1) || (pSStack_18->pg_end[pSStack_18->npg_end + -1] != k_3)) {
            for (r_2 = 0; r_2 < pSStack_18->npg_end; r_2 = r_2 + 1) {
              if (pSStack_18->pg_end[r_2] == k_3) {
                memmove(pSStack_18->pg_end + r_2,pSStack_18->pg_end + (r_2 + 1),
                        (long)((pSStack_18->npg_end - r_2) + -1) << 2);
                pSStack_18->npg_end = pSStack_18->npg_end + -1;
              }
            }
          }
          else {
            pSStack_18->npg_end = pSStack_18->npg_end + -1;
          }
        }
      }
    }
    if (pSStack_18->pg[iStack_64].name != (char *)0x0) {
      local_78 = kh_put_m_s2i(pSStack_18->pg_hash,pSStack_18->pg[iStack_64].name,&local_7c);
      if (local_7c == -1) {
        return -1;
      }
      pSStack_18->pg_hash->vals[local_78] = iStack_64;
    }
    if (pSStack_18->npg_end_alloc <= pSStack_18->npg_end) {
      if (pSStack_18->npg_end_alloc == 0) {
        local_80 = 4;
      }
      else {
        local_80 = pSStack_18->npg_end_alloc << 1;
      }
      pSStack_18->npg_end_alloc = local_80;
      piVar8 = (int *)realloc(pSStack_18->pg_end,(long)pSStack_18->npg_end_alloc << 2);
      pSStack_18->pg_end = piVar8;
      if (pSStack_18->pg_end == (int *)0x0) {
        return -1;
      }
    }
    iVar1 = pSStack_18->npg_end;
    pSStack_18->npg_end = iVar1 + 1;
    pSStack_18->pg_end[iVar1] = iStack_64;
    pSStack_18->npg = pSStack_18->npg + 1;
  }
  return 0;
}

Assistant:

static int sam_hdr_update_hashes(SAM_hdr *sh,
				 int type,
				 SAM_hdr_type *h_type) {
    /* Add to reference hash? */
    if ((type>>8) == 'S' && (type&0xff) == 'Q') {
	SAM_hdr_tag *tag;
	int nref = sh->nref;

	sh->ref = realloc(sh->ref, (sh->nref+1)*sizeof(*sh->ref));
	if (!sh->ref)
	    return -1;

	tag = h_type->tag;
	sh->ref[nref].name = NULL;
	sh->ref[nref].len  = 0;
	sh->ref[nref].ty = h_type;
	sh->ref[nref].tag  = tag;

	while (tag) {
	    if (tag->str[0] == 'S' && tag->str[1] == 'N') {
		if (!(sh->ref[nref].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->ref[nref].name, tag->str+3, tag->len-3);
		sh->ref[nref].name[tag->len-3] = 0;
	    } else if (tag->str[0] == 'L' && tag->str[1] == 'N') {
		sh->ref[nref].len = atoi(tag->str+3);
	    }
	    tag = tag->next;
	}

	if (sh->ref[nref].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->ref_hash, sh->ref[nref].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->ref_hash, k) = nref;
	}

	sh->nref++;
    }

    /* Add to read-group hash? */
    if ((type>>8) == 'R' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int nrg = sh->nrg;

	sh->rg = realloc(sh->rg, (sh->nrg+1)*sizeof(*sh->rg));
	if (!sh->rg)
	    return -1;

	tag = h_type->tag;
	sh->rg[nrg].name = NULL;
	sh->rg[nrg].name_len = 0;
	sh->rg[nrg].ty   = h_type;
	sh->rg[nrg].tag  = tag;
	sh->rg[nrg].id   = nrg;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->rg[nrg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->rg[nrg].name, tag->str+3, tag->len-3);
		sh->rg[nrg].name[tag->len-3] = 0;
		sh->rg[nrg].name_len = strlen(sh->rg[nrg].name);
	    }
	    tag = tag->next;
	}

	if (sh->rg[nrg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->rg_hash, sh->rg[nrg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->rg_hash, k) = nrg;
	}

	sh->nrg++;
    }

    /* Add to program hash? */
    if ((type>>8) == 'P' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int npg = sh->npg;

	sh->pg = realloc(sh->pg, (sh->npg+1)*sizeof(*sh->pg));
	if (!sh->pg)
	    return -1;

	tag = h_type->tag;
	sh->pg[npg].name = NULL;
	sh->pg[npg].name_len = 0;
	sh->pg[npg].ty  = h_type;
	sh->pg[npg].tag  = tag;
	sh->pg[npg].id   = npg;
	sh->pg[npg].prev_id = -1;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->pg[npg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->pg[npg].name, tag->str+3, tag->len-3);
		sh->pg[npg].name[tag->len-3] = 0;
		sh->pg[npg].name_len = strlen(sh->pg[npg].name);
	    } else if (tag->str[0] == 'P' && tag->str[1] == 'P') {
		// Resolve later if needed
		khint_t k;
		char tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
		k = kh_get(m_s2i, sh->pg_hash, tag->str+3);
		tag->str[tag->len] = tmp;

		if (k != kh_end(sh->pg_hash)) {
		    int p_id = kh_val(sh->pg_hash, k);
		    sh->pg[npg].prev_id = sh->pg[p_id].id;

		    /* Unmark previous entry as a PG termination */
		    if (sh->npg_end > 0 &&
			sh->pg_end[sh->npg_end-1] == p_id) {
			sh->npg_end--;
		    } else {
			int i;
			for (i = 0; i < sh->npg_end; i++) {
			    if (sh->pg_end[i] == p_id) {
				memmove(&sh->pg_end[i], &sh->pg_end[i+1],
					(sh->npg_end-i-1)*sizeof(*sh->pg_end));
				sh->npg_end--;
			    }
			}
		    }
		} else {
		    sh->pg[npg].prev_id = -1;
		}
	    }
	    tag = tag->next;
	}

	if (sh->pg[npg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->pg_hash, sh->pg[npg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->pg_hash, k) = npg;
	}

	/* Add to npg_end[] array. Remove later if we find a PP line */
	if (sh->npg_end >= sh->npg_end_alloc) {
	    sh->npg_end_alloc = sh->npg_end_alloc
		? sh->npg_end_alloc*2
		: 4;
	    sh->pg_end = realloc(sh->pg_end,
				 sh->npg_end_alloc * sizeof(int));
	    if (!sh->pg_end)
		return -1;
	}
	sh->pg_end[sh->npg_end++] = npg;

	sh->npg++;
    }

    return 0;
}